

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O1

int runner(TestReporter *reporter,char *test_library_name,char *suite_name,char *test_name,
          _Bool verbose,_Bool dont_run)

{
  _Bool _Var1;
  int iVar2;
  undefined4 uVar3;
  int iVar4;
  uint uVar5;
  undefined8 uVar6;
  CgreenVector *pCVar7;
  void *pvVar8;
  size_t sVar9;
  long lVar10;
  TestSuite *parent;
  TestItem *pTVar11;
  undefined8 *puVar12;
  CgreenTest *test;
  long lVar13;
  char *pcVar14;
  undefined7 in_register_00000081;
  char cVar15;
  ulong uVar16;
  int local_6c;
  char *local_58;
  ContextSuite *local_38;
  
  uVar16 = CONCAT71(in_register_00000081,verbose) & 0xffffffff;
  uVar6 = get_test_reporter();
  pCVar7 = (CgreenVector *)
           mock_(uVar6,"discover_tests_in",
                 "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tools/discoverer.mock"
                 ,0xd,"filename, verbose",test_library_name,uVar16);
  iVar2 = cgreen_vector_size(pCVar7);
  if (iVar2 == 0) {
    __printf_chk(1,"No tests found in \'%s\'.\n",test_library_name);
    return 1;
  }
  cVar15 = (char)uVar16;
  if (cVar15 != '\0') {
    uVar3 = cgreen_vector_size(pCVar7);
    __printf_chk(1,"Discovered %d test(s)\n",uVar3);
  }
  pvVar8 = memchr("./",(int)*test_library_name,3);
  if (pvVar8 == (void *)0x0) {
    sVar9 = strlen(test_library_name);
    local_58 = (char *)malloc(sVar9 + 3);
    local_58[0] = '.';
    local_58[1] = '/';
    local_58[2] = '\0';
    strcat(local_58,test_library_name);
  }
  else {
    local_58 = strdup(test_library_name);
  }
  pCVar7 = sorted_test_items_from(pCVar7);
  if (cVar15 != '\0') {
    __printf_chk(1,"Opening [%s]",test_library_name);
  }
  lVar10 = dlopen(local_58,2);
  if (lVar10 == 0) {
    uVar6 = dlerror();
    panic("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tools/runner.c",
          0x12e,"dlopen failure when trying to run \'%s\' (error: %s)\n",local_58,uVar6);
  }
  iVar2 = 0;
  if (!dont_run) {
    local_38 = (ContextSuite *)0x0;
    parent = (TestSuite *)
             create_named_test_suite_
                       (suite_name,
                        "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tools/runner.c"
                        ,0xc3);
    iVar2 = cgreen_vector_size(pCVar7);
    if (iVar2 < 1) {
      local_6c = 0;
    }
    else {
      local_6c = 0;
      iVar2 = 0;
      do {
        if (test_name == (char *)0x0) {
LAB_00102542:
          puVar12 = (undefined8 *)cgreen_vector_get(pCVar7,iVar2);
          uVar6 = *puVar12;
          test = (CgreenTest *)dlsym(lVar10,uVar6);
          lVar13 = dlerror();
          if (lVar13 != 0) {
            panic("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tools/runner.c"
                  ,0x98,"Could not find specification_name symbol \'%s\'",uVar6);
          }
          pTVar11 = (TestItem *)cgreen_vector_get(pCVar7,iVar2);
          add_test_to_context(parent,&local_38,pTVar11,test);
          local_6c = local_6c + 1;
        }
        else {
          pTVar11 = (TestItem *)cgreen_vector_get(pCVar7,iVar2);
          _Var1 = test_matches_pattern(test_name,pTVar11);
          if (_Var1) goto LAB_00102542;
        }
        iVar2 = iVar2 + 1;
        iVar4 = cgreen_vector_size(pCVar7);
      } while (iVar2 < iVar4);
    }
    iVar2 = 1;
    if (-1 < local_6c) {
      if (local_6c == 1 && test_name != (char *)0x0) {
        _Var1 = matching_test_exists(test_name,pCVar7);
        if (verbose) {
          __printf_chk(1," to only run one test: \'%s\' ...\n",test_name);
        }
        if (_Var1) {
          pcVar14 = test_name_of(test_name);
          uVar5 = run_single_test(parent,pcVar14,reporter);
          test_name = (char *)(ulong)uVar5;
          free(pcVar14);
        }
        else {
          __fprintf_chk(_stderr,1,"ERROR: No such test: \'%s\' in \'%s\'\n",test_name,suite_name);
        }
        iVar4 = (int)test_name;
        if (!_Var1) goto LAB_00102759;
      }
      else {
        if (verbose) {
          iVar2 = cgreen_vector_size(pCVar7);
          if (local_6c == iVar2) {
            iVar2 = cgreen_vector_size(pCVar7);
            pcVar14 = " to run all %d discovered tests ...\n";
          }
          else {
            pcVar14 = " to run %d matching tests ...\n";
            iVar2 = local_6c;
          }
          __printf_chk(1,pcVar14,iVar2);
        }
        if (local_6c == 0) {
          __fprintf_chk(_stderr,1,"ERROR: No such test: \'%s\' in \'%s\'\n",test_name,suite_name);
          iVar4 = 1;
        }
        else {
          iVar4 = run_test_suite(parent,reporter);
        }
      }
      iVar2 = iVar4;
      destroy_test_suite(parent);
      destroy_context_suites(local_38);
    }
  }
LAB_00102759:
  dlclose(lVar10);
  free(local_58);
  destroy_cgreen_vector(pCVar7);
  return iVar2;
}

Assistant:

int runner(TestReporter *reporter, const char *test_library_name,
           const char *suite_name, const char *test_name,
           bool verbose, bool dont_run) {
    int status = 0;
    void *test_library_handle = NULL;

    CgreenVector *tests = discover_tests_in(test_library_name, verbose);

    if (count(tests) == 0) {
        printf("No tests found in '%s'.\n", test_library_name);
        return 1;
    }

    if (verbose)
        printf("Discovered %d test(s)\n", count(tests));

    char *absolute_library_name = absolute(test_library_name);
    tests = sorted_test_items_from(tests);
    if (verbose)
        printf("Opening [%s]", test_library_name);
    test_library_handle = dlopen(absolute_library_name, RTLD_NOW);
    if (test_library_handle == NULL) {
        PANIC("dlopen failure when trying to run '%s' (error: %s)\n",
              absolute_library_name, dlerror());
        status = 2;
    } else {
        if (!dont_run) {
            status = run_tests(reporter, suite_name, test_name, test_library_handle,
                               tests, verbose);
        }
        dlclose(test_library_handle);
    }
    free(absolute_library_name);

    destroy_cgreen_vector(tests);

    return status;
}